

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFmap.c
# Opt level: O2

NF_link_map * NF_map(NF_list *nl,int mode,void *addr)

{
  anon_union_8_2_f9000a74_for_d_un *paVar1;
  void *__s;
  long *plVar2;
  byte bVar3;
  Elf64_Word EVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t uVar8;
  ulong uVar9;
  undefined8 uVar10;
  byte bVar11;
  long lVar12;
  Elf64_Xword EVar13;
  int iVar14;
  Elf64_Phdr *__buf;
  Elf64_Phdr *pEVar15;
  ssize_t sVar16;
  uint *puVar17;
  Elf64_Dyn *pEVar18;
  NF_link_map *pNVar19;
  long lVar20;
  char *pcVar21;
  long lVar22;
  Elf64_Dyn **ppEVar23;
  uint uVar24;
  void *__s_00;
  size_t sVar25;
  ulong *puVar26;
  void *pvVar27;
  ulong *puVar28;
  uint uVar29;
  void *pvVar30;
  long lVar31;
  undefined1 auVar32 [16];
  long alStack_b0 [5];
  long alStack_88 [6];
  NF_link_map *local_58;
  ulong local_50;
  Elf64_Phdr *local_48;
  undefined8 uStack_40;
  NF_list *local_38;
  
  pNVar19 = nl->map;
  sVar25 = pNVar19->l_phlen;
  alStack_88[5] = 0x1037c2;
  __buf = (Elf64_Phdr *)malloc(sVar25);
  alStack_88[5] = 0x1037dc;
  local_38 = nl;
  pread(nl->fd,__buf,sVar25,pNVar19->l_phoff);
  lVar12 = -(ulong)((uint)pNVar19->l_phnum * 0x30);
  puVar28 = (ulong *)((long)&local_58 + lVar12);
  pEVar15 = __buf + pNVar19->l_phnum;
  uVar24 = 0;
  local_48 = __buf;
  uVar29 = 0;
  for (; lVar20 = (long)(int)uVar29, __buf < pEVar15; __buf = __buf + 1) {
    EVar4 = __buf->p_type;
    if (EVar4 == 6) {
      pNVar19->l_phdr = (Elf64_Phdr *)__buf->p_vaddr;
    }
    else if (EVar4 == 2) {
      pNVar19->l_ld = (Elf64_Dyn *)__buf->p_vaddr;
      pNVar19->l_ldnum = (uint16_t)((uint)__buf->p_memsz >> 4);
    }
    else if (EVar4 == 1) {
      lVar22 = lVar20 * 0x30;
      uVar6 = __buf->p_vaddr;
      puVar28[lVar20 * 6] = uVar6 & 0xfffffffffffff000;
      EVar13 = __buf->p_memsz;
      auVar32._8_4_ = (int)uVar6;
      auVar32._0_8_ = uVar6;
      auVar32._12_4_ = (int)(uVar6 >> 0x20);
      lVar31 = uVar6 + __buf->p_filesz;
      *(ulong *)((long)&local_50 + lVar22 + lVar12) = lVar31 + 0xfffU & 0xfffffffffffff000;
      plVar2 = (long *)((long)&local_48 + lVar22 + lVar12);
      *plVar2 = lVar31;
      plVar2[1] = auVar32._8_8_ + EVar13;
      *(Elf64_Off *)((long)&local_38 + lVar22 + lVar12) = __buf->p_offset & 0xfffffffffffff000;
      if (0 < (int)uVar29) {
        uVar24 = (uint)(byte)((byte)uVar24 |
                             puVar28[lVar20 * 6 + -5] != (uVar6 & 0xfffffffffffff000));
      }
      uVar29 = uVar29 + 1;
      bVar3 = (byte)__buf->p_flags;
      bVar11 = bVar3 << 4;
      *(uint *)(puVar28 + lVar20 * 6 + 5) =
           (uint)((byte)((bVar11 | bVar3 >> 4) * '\x02' & 0x40 |
                        ((bVar11 & 0x10) << 2 | (bVar11 & 0x40) >> 2) * '\x02') >> 5);
    }
  }
  if ((int)uVar29 < 2) {
    pcVar21 = "Wrong type of shared object or ELF: LOAD segment less than 2";
  }
  else {
    uStack_40._4_4_ = uVar24;
    if (addr != (void *)0x0) {
      local_50 = *puVar28;
      sVar25 = *(long *)((long)alStack_88 + lVar20 * 0x30 + lVar12 + 0x18) - *puVar28;
      local_38 = (NF_list *)CONCAT44(local_38._4_4_,local_38->fd);
      uVar24 = *(uint *)(&stack0xffffffffffffffd0 + lVar12);
      *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103936;
      iVar14 = mprotect(addr,sVar25,uVar24 | 2);
      if (iVar14 == 0) {
        pNVar19->l_map_start = (uint64_t)addr;
        pNVar19->l_map_end = sVar25 + (long)addr;
        pNVar19->l_addr = (long)addr - local_50;
        if ((uStack_40._4_4_ & 1) != 0) {
          lVar22 = (ulong)uVar29 * 0x30;
          lVar20 = *(long *)((long)alStack_b0 + lVar22 + lVar12);
          lVar22 = *(long *)((long)alStack_88 + lVar22 + lVar12);
          *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103977;
          mprotect((void *)(((long)addr - local_50) + lVar20),lVar22 - lVar20,0);
        }
        puVar26 = puVar28 + (ulong)uVar29 * 6;
        local_58 = pNVar19;
        for (; puVar28 < puVar26; puVar28 = puVar28 + 6) {
          uVar6 = *puVar28;
          uVar7 = puVar28[1];
          uVar8 = pNVar19->l_addr;
          uVar9 = puVar28[4];
          *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x1039a7;
          sVar16 = pread((int)local_38,(void *)(uVar8 + uVar6),uVar7 - uVar6,uVar9);
          if (sVar16 < 0) {
            pcVar21 = pNVar19->l_name;
            *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103bb7;
            puVar17 = (uint *)__errno_location();
            uVar24 = *puVar17;
            *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103bca;
            printf("error when reading library %s, and the errno is %d",pcVar21,(ulong)uVar24);
            goto LAB_00103bca;
          }
          uVar6 = *puVar28;
          uVar7 = puVar28[1];
          uVar8 = pNVar19->l_addr;
          uVar9 = puVar28[5];
          *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x1039cc;
          mprotect((void *)(uVar8 + uVar6),uVar7 - uVar6,(uint)uVar9 | 2);
          if (pNVar19->l_phdr == (Elf64_Phdr *)0x0) {
            uVar6 = pNVar19->l_phoff;
            uVar7 = puVar28[4];
            if ((uVar7 <= uVar6) &&
               ((ulong)pNVar19->l_phnum * 0x38 + uVar6 <= (uVar7 + puVar28[1]) - *puVar28)) {
              pNVar19->l_phdr = (Elf64_Phdr *)((uVar6 - uVar7) + *puVar28);
            }
          }
          uVar6 = puVar28[2];
          if (uVar6 < puVar28[3]) {
            uVar8 = pNVar19->l_addr;
            __s = (void *)(uVar8 + uVar6);
            pvVar30 = (void *)(puVar28[3] + uVar8);
            pvVar27 = (void *)(uVar8 + uVar6 + 0xfff & 0xfffffffffffff000);
            __s_00 = pvVar27;
            if (pvVar30 < pvVar27) {
              __s_00 = pvVar30;
            }
            if (__s <= __s_00 && (long)__s_00 - (long)__s != 0) {
              *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103a4c;
              memset(__s,0,(long)__s_00 - (long)__s);
            }
            pNVar19 = local_58;
            if (pvVar27 < pvVar30) {
              *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103a76;
              memset(__s_00,0,((long)pvVar30 + 0xfffU & 0xfffffffffffff000) - (long)__s_00);
            }
          }
        }
        uVar8 = pNVar19->l_addr;
        if (pNVar19->l_phdr != (Elf64_Phdr *)0x0) {
          local_48 = pNVar19->l_phdr;
        }
        pNVar19->l_phdr = (Elf64_Phdr *)((long)&local_48->p_type + uVar8);
        pEVar18 = (Elf64_Dyn *)((long)&pNVar19->l_ld->d_tag + uVar8);
        pNVar19->l_ld = pEVar18;
        do {
          uVar6 = pEVar18->d_tag;
          if (uVar6 == 0) {
            if (pNVar19->l_info[6] != (Elf64_Dyn *)0x0) {
              paVar1 = &pNVar19->l_info[6]->d_un;
              paVar1->d_val = paVar1->d_val + uVar8;
            }
            if (pNVar19->l_info[5] != (Elf64_Dyn *)0x0) {
              paVar1 = &pNVar19->l_info[5]->d_un;
              paVar1->d_val = paVar1->d_val + pNVar19->l_addr;
            }
            if (pNVar19->l_info[7] != (Elf64_Dyn *)0x0) {
              paVar1 = &pNVar19->l_info[7]->d_un;
              paVar1->d_val = paVar1->d_val + pNVar19->l_addr;
            }
            if (pNVar19->l_info[0x17] != (Elf64_Dyn *)0x0) {
              paVar1 = &pNVar19->l_info[0x17]->d_un;
              paVar1->d_val = paVar1->d_val + pNVar19->l_addr;
            }
            paVar1 = &pNVar19->l_info[0x23]->d_un;
            paVar1->d_val = paVar1->d_val + pNVar19->l_addr;
            puVar17 = (uint *)(pNVar19->l_info[0x23]->d_un).d_val;
            uVar24 = *puVar17;
            pNVar19->l_nbuckets = uVar24;
            uVar29 = puVar17[1];
            uVar5 = puVar17[2];
            pNVar19->l_gnu_bitmask_idxbits = uVar5 - 1;
            pNVar19->l_gnu_shift = puVar17[3];
            pNVar19->l_gnu_bitmask = (Elf64_Addr *)(puVar17 + 4);
            pNVar19->l_gnu_buckets = puVar17 + (ulong)(uVar5 * 2) + 4;
            pNVar19->l_gnu_chain_zero =
                 puVar17 + (ulong)(uVar5 * 2) + 4 + ((ulong)uVar24 - (ulong)uVar29);
            return pNVar19;
          }
          if (uVar6 < 0x23) {
            ppEVar23 = pNVar19->l_info + uVar6;
LAB_00103ae1:
            *ppEVar23 = pEVar18;
          }
          else {
            ppEVar23 = pNVar19->l_info + 0x22;
            if ((uVar6 == 0x6ffffff9) || (ppEVar23 = pNVar19->l_info + 0x23, uVar6 == 0x6ffffef5))
            goto LAB_00103ae1;
          }
          pEVar18 = pEVar18 + 1;
        } while( true );
      }
      *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103bee;
      puVar17 = (uint *)__errno_location();
      uVar24 = *puVar17;
      *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103bfe;
      printf("error when calling mprotect, and the error code is %d\n",(ulong)uVar24);
      goto LAB_00103bca;
    }
    pcVar21 = "please map the so in a malloc\'d region";
  }
  *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103be7;
  puts(pcVar21);
LAB_00103bca:
  *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0xffffffffffffffff;
  uVar10 = *(undefined8 *)((long)alStack_88 + lVar12 + 0x28);
  *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103bd2;
  exit((int)uVar10);
}

Assistant:

struct NF_link_map *NF_map(struct NF_list *nl, int mode, void *addr)
{
    //int fd;

    /* TODO: actually serach directories here */
    //fd = open(file, O_RDONLY, 0);
    /* it may help to know the SONAME and REALNAME of a so */

    //struct filebuf fb;

    /* just cram into buf as much as you can */
    /* use a do-while can assure this event won't be interrupted */
    //size_t retlen = read(fd, fb.buf, sizeof(fb.buf) - fb.len);

    /* the information we get from ehdr is merely phnum, total length of all program headers, and offset for program headers
     * so we dump filebuf in NF_list, instead it is added as NF_link_map members
     * also ``Elf64_Addr`` is always sufficient for ``maplength``, for it is a memory length
     */
    //Elf64_Ehdr *ehdr = (Elf64_Ehdr *)nl->fb.buf;
    //size_t maplength = ehdr->e_phnum * sizeof(Elf64_Phdr);

    /* create a new link map, and fill in header table info */
    //struct NF_link_map *l = calloc(sizeof(struct NF_link_map), 1);
    //l->l_phnum = ehdr->e_phnum;

    /* note that in dl-load: open_verify 
     * That function open an file with a little bit check to the phdrs
     * And the same thing just appear once again in _dl_map_object_from_fd
     */
    /* store the phdrs on heap for further loading */
    //Elf64_Phdr *phdr = malloc(maplength);
    //pread(nl->fd, (void *)phdr, maplength, ehdr->e_phoff);

    struct NF_link_map *l = nl->map;
    Elf64_Phdr *phdr = malloc(l->l_phlen);
    pread(nl->fd, (void *)phdr, l->l_phlen, l->l_phoff);

    struct loadcmd loadcmds[l->l_phnum];
    int nloadcmds = 0;
    bool has_holes = false;

    Elf64_Phdr *ph;
    /* travese the segments! */
    for (ph = phdr; ph < &phdr[l->l_phnum]; ++ph)
    {
        switch (ph->p_type)
        {
        case PT_LOAD:
        {
            /* load and add it to loadcmds */
            struct loadcmd *c = &loadcmds[nloadcmds++]; //get the current loaction in loadcmds
            /* TODO: pagesize are set to 4096 for simplicity */
            c->mapstart = ALIGN_DOWN(ph->p_vaddr, 4096);
            c->mapend = ALIGN_UP(ph->p_vaddr + ph->p_filesz, 4096);
            c->dataend = ph->p_vaddr + ph->p_filesz;
            c->allocend = ph->p_vaddr + ph->p_memsz;
            c->mapoff = ALIGN_DOWN(ph->p_offset, 4096);

            /* hey ELF, is it your last segment? */
            if (nloadcmds > 1 && c[-1].mapend != c->mapstart)
                has_holes = true;

            /* setting the protection of this segment. may have errors */
            c->prot = 0;
            c->prot |= (ph->p_flags & PF_R) >> 2;
            c->prot |= ph->p_flags & PF_W;
            c->prot |= (ph->p_flags & PF_X) << 2;

            break;
        }
        case PT_PHDR:
            /* the PHT itself, usually the first one */
            /* or it may not exist at all, in which case it says "use ld.so to find it in a LOAD segment" */
            l->l_phdr = (void *)ph->p_vaddr;
            break;

        case PT_DYNAMIC:
            /* the dynamic section */
            l->l_ld = (void *)ph->p_vaddr;
            l->l_ldnum = ph->p_memsz / sizeof(Elf64_Dyn);
            break;

        default:
            break;
        }
    }

    /* now map LOAD segments into memory */
    size_t maplength = loadcmds[nloadcmds - 1].allocend - loadcmds[0].mapstart;
    map_segments(l, addr, loadcmds, nloadcmds, has_holes, nl->fd, maplength);

    if (l->l_phdr == NULL)
        /* This is expected. I don't know why l_phdr is not allocated 
     * It's probably because of capatiabilty issue, sigh
     */
        l->l_phdr = phdr;

    /* After loading, the absolute address is set, now relocate the PHT */
    l->l_phdr = (Elf64_Phdr *)((Elf64_Addr)l->l_phdr + l->l_addr);

    /* rebasing ld to prevent SIGSEGV */
    l->l_ld = (Elf64_Dyn *)((Elf64_Addr)l->l_ld + l->l_addr);
    /* indexing the l_ld into l_info */
    fill_info(l);

    setup_hash(l);

    return l;
}